

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

bool CompileTypemask(SQIntVec *res,SQChar *typemask)

{
  char cVar1;
  bool bVar2;
  longlong *plVar3;
  ulong uVar4;
  ulong uVar5;
  SQUnsignedInteger SVar6;
  long lVar7;
  
  cVar1 = *typemask;
  if (cVar1 != '\0') {
    lVar7 = 0;
    uVar5 = 0;
    do {
      lVar7 = lVar7 + 2;
      while (cVar1 == ' ') {
        cVar1 = typemask[lVar7 + -1];
        lVar7 = lVar7 + 1;
        if (cVar1 == '\0') goto LAB_001252d1;
      }
      bVar2 = false;
      switch(cVar1) {
      case 'a':
        uVar4 = 0x40;
        break;
      case 'b':
        uVar4 = 8;
        break;
      case 'c':
        uVar4 = 0x300;
        break;
      case 'd':
      case 'e':
      case 'h':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'q':
      case 'w':
        goto switchD_00125194_caseD_64;
      case 'f':
        uVar4 = 4;
        break;
      case 'g':
        uVar4 = 0x400;
        break;
      case 'i':
        uVar4 = 2;
        break;
      case 'n':
        uVar4 = 6;
        break;
      case 'o':
        uVar4 = 1;
        break;
      case 'p':
        uVar4 = 0x800;
        break;
      case 'r':
        uVar4 = 0x10000;
        break;
      case 's':
        uVar4 = 0x10;
        break;
      case 't':
        uVar4 = 0x20;
        break;
      case 'u':
        uVar4 = 0x80;
        break;
      case 'v':
        uVar4 = 0x1000;
        break;
      case 'x':
        uVar4 = 0x8000;
        break;
      case 'y':
        uVar4 = 0x4000;
        break;
      default:
        bVar2 = false;
        if (cVar1 == '.') {
          plVar3 = res->_vals;
          uVar5 = res->_size;
          if (res->_allocated <= uVar5) {
            SVar6 = uVar5 * 2;
            if (SVar6 == 0) {
              SVar6 = 4;
            }
            plVar3 = (longlong *)sq_vm_realloc(plVar3,res->_allocated << 3,SVar6 * 8);
            res->_vals = plVar3;
            res->_allocated = SVar6;
            uVar5 = res->_size;
          }
          res->_size = uVar5 + 1;
          plVar3[uVar5] = -1;
          goto LAB_001252c3;
        }
        goto switchD_00125194_caseD_64;
      }
      uVar5 = uVar5 | uVar4;
      if (typemask[lVar7 + -1] == '|') {
        if (typemask[lVar7] == '\0') {
          return false;
        }
      }
      else {
        plVar3 = res->_vals;
        uVar4 = res->_size;
        if (res->_allocated <= uVar4) {
          SVar6 = uVar4 * 2;
          if (SVar6 == 0) {
            SVar6 = 4;
          }
          plVar3 = (longlong *)sq_vm_realloc(plVar3,res->_allocated << 3,SVar6 * 8);
          res->_vals = plVar3;
          res->_allocated = SVar6;
          uVar4 = res->_size;
        }
        res->_size = uVar4 + 1;
        plVar3[uVar4] = uVar5;
LAB_001252c3:
        lVar7 = lVar7 + -1;
        uVar5 = 0;
      }
      cVar1 = typemask[lVar7];
    } while (cVar1 != '\0');
  }
LAB_001252d1:
  bVar2 = true;
switchD_00125194_caseD_64:
  return bVar2;
}

Assistant:

bool CompileTypemask(SQIntVec &res,const SQChar *typemask)
{
    SQInteger i = 0;
    SQInteger mask = 0;
    while(typemask[i] != 0) {
        switch(typemask[i]) {
            case 'o': mask |= _RT_NULL; break;
            case 'i': mask |= _RT_INTEGER; break;
            case 'f': mask |= _RT_FLOAT; break;
            case 'n': mask |= (_RT_FLOAT | _RT_INTEGER); break;
            case 's': mask |= _RT_STRING; break;
            case 't': mask |= _RT_TABLE; break;
            case 'a': mask |= _RT_ARRAY; break;
            case 'u': mask |= _RT_USERDATA; break;
            case 'c': mask |= (_RT_CLOSURE | _RT_NATIVECLOSURE); break;
            case 'b': mask |= _RT_BOOL; break;
            case 'g': mask |= _RT_GENERATOR; break;
            case 'p': mask |= _RT_USERPOINTER; break;
            case 'v': mask |= _RT_THREAD; break;
            case 'x': mask |= _RT_INSTANCE; break;
            case 'y': mask |= _RT_CLASS; break;
            case 'r': mask |= _RT_WEAKREF; break;
            case '.': mask = -1; res.push_back(mask); i++; mask = 0; continue;
            case ' ': i++; continue; //ignores spaces
            default:
                return false;
        }
        i++;
        if(typemask[i] == '|') {
            i++;
            if(typemask[i] == 0)
                return false;
            continue;
        }
        res.push_back(mask);
        mask = 0;

    }
    return true;
}